

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

kp_error_t kp_cfg_find(kp_ctx *ctx,char *path,char *cfg_path,size_t size)

{
  int iVar1;
  kp_error_t kVar2;
  ulong uVar3;
  char *pcVar4;
  int *piVar5;
  char cVar6;
  long in_FS_OFFSET;
  stat stats;
  char abspath [4096];
  stat local_10c8;
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = strlcat(cfg_path,path,size);
  if (uVar3 < size) {
    do {
      pcVar4 = strrchr(cfg_path,0x2f);
      if (pcVar4 == (char *)0x0 && cfg_path == (char *)0x0) {
        piVar5 = __errno_location();
        *piVar5 = 2;
        goto LAB_00103bcf;
      }
      if (pcVar4 == (char *)0x0) {
        pcVar4 = cfg_path;
      }
      memset(local_1038,0,0x1000);
      *pcVar4 = '\0';
      iVar1 = __snprintf_chk(local_1038,0x1000,1,0x1000,"%s/%s/.config",ctx->ws_path,cfg_path);
      if (iVar1 < 0x1000) {
        iVar1 = stat(local_1038,&local_10c8);
        cVar6 = '\x03';
        if (iVar1 < 0) {
          piVar5 = __errno_location();
          cVar6 = (*piVar5 == 2) + '\x01';
        }
      }
      else {
        piVar5 = __errno_location();
        *piVar5 = 0x24;
        cVar6 = '\x01';
      }
    } while (cVar6 == '\x02');
    if (cVar6 == '\x03') {
      kVar2 = 0;
      goto LAB_00103bd4;
    }
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0x24;
  }
LAB_00103bcf:
  kVar2 = 5;
LAB_00103bd4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return kVar2;
  }
  __stack_chk_fail();
}

Assistant:

kp_error_t
kp_cfg_find(struct kp_ctx *ctx, const char *path, char *cfg_path, size_t size)
{
	char *dir = NULL;
	struct stat stats;

	if (strlcat(cfg_path, path, size) >= size) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	while ((dir = strrchr(cfg_path, '/')) != NULL
	       || ((dir != cfg_path) && (dir = cfg_path))) {
		char abspath[PATH_MAX] = "";

		dir[0] = '\0';

		if (snprintf(abspath, PATH_MAX, "%s/%s/" KP_CONFIG_SAFE_NAME,
                    ctx->ws_path, cfg_path) >= PATH_MAX) {
			errno = ENAMETOOLONG;
			return KP_ERRNO;
		}

		if (stat(abspath, &stats) < 0) {
			if (errno == ENOENT) {
				continue;
			}
			return KP_ERRNO;
		} else {
			break;
		}
	}

	if (dir == NULL) {
		errno = ENOENT;
		return KP_ERRNO;
	}

	return KP_SUCCESS;
}